

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O2

int __thiscall gl3cts::GL33ShaderTests::init(GL33ShaderTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ShaderLibraryGroup *pSVar1;
  FragDepthTests *this_00;
  ShaderIndexingTests *this_01;
  ShaderLoopTests *this_02;
  ShaderStructTests *this_03;
  ShaderSwitchTests *this_04;
  UniformBlockTests *this_05;
  ShaderIntegerMixTests *this_06;
  ShaderNegativeTests *this_07;
  
  pSVar1 = (ShaderLibraryGroup *)operator_new(0x98);
  deqp::ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar1,(this->super_TestCaseGroup).m_context,"arrays","Array Tests","gl33/arrays.test")
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  this_00 = (FragDepthTests *)operator_new(0x80);
  deqp::FragDepthTests::FragDepthTests
            (this_00,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (ShaderIndexingTests *)operator_new(0x80);
  deqp::ShaderIndexingTests::ShaderIndexingTests
            (this_01,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (ShaderLoopTests *)operator_new(0x80);
  deqp::ShaderLoopTests::ShaderLoopTests
            (this_02,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  pSVar1 = (ShaderLibraryGroup *)operator_new(0x98);
  deqp::ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar1,(this->super_TestCaseGroup).m_context,"preprocessor","Preprocessor Tests",
             "gl33/preprocessor.test");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  this_03 = (ShaderStructTests *)operator_new(0x80);
  deqp::ShaderStructTests::ShaderStructTests
            (this_03,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  this_04 = (ShaderSwitchTests *)operator_new(0x80);
  deqp::ShaderSwitchTests::ShaderSwitchTests
            (this_04,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  this_05 = (UniformBlockTests *)operator_new(0x80);
  deqp::UniformBlockTests::UniformBlockTests
            (this_05,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_05);
  this_06 = (ShaderIntegerMixTests *)operator_new(0x80);
  deqp::ShaderIntegerMixTests::ShaderIntegerMixTests
            (this_06,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_06);
  this_07 = (ShaderNegativeTests *)operator_new(0x80);
  deqp::ShaderNegativeTests::ShaderNegativeTests
            (this_07,(this->super_TestCaseGroup).m_context,GLSL_VERSION_330);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_07);
  return extraout_EAX;
}

Assistant:

void init(void)
	{
		addChild(new deqp::ShaderLibraryGroup(m_context, "arrays", "Array Tests", "gl33/arrays.test"));
		addChild(new deqp::FragDepthTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::ShaderIndexingTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::ShaderLoopTests(m_context, glu::GLSL_VERSION_330));
		addChild(
			new deqp::ShaderLibraryGroup(m_context, "preprocessor", "Preprocessor Tests", "gl33/preprocessor.test"));
		addChild(new deqp::ShaderStructTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::ShaderSwitchTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::UniformBlockTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::ShaderIntegerMixTests(m_context, glu::GLSL_VERSION_330));
		addChild(new deqp::ShaderNegativeTests(m_context, glu::GLSL_VERSION_330));
	}